

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O3

stbi_uc * stbi_load_from_memory(stbi_uc *buffer,int len,int *x,int *y,int *comp,int req_comp)

{
  uint8 uVar1;
  int iVar2;
  uint32 uVar3;
  stbi_uc *psVar4;
  long lVar5;
  float *data;
  byte *pbVar6;
  byte bVar7;
  char cVar8;
  uint uVar9;
  byte *pbVar10;
  stbi_loader **ppsVar11;
  jpeg j;
  jpeg local_3740;
  
  local_3740.s.img_file = (FILE *)0x0;
  pbVar6 = buffer + len;
  local_3740.marker = 0xff;
  local_3740.s.img_buffer = buffer;
  local_3740.s.img_buffer_end = pbVar6;
  uVar1 = get_marker(&local_3740);
  if (uVar1 == 0xd8) {
    local_3740.s.img_file = (FILE *)0x0;
    local_3740.s.img_buffer = buffer;
    local_3740.s.img_buffer_end = pbVar6;
    psVar4 = load_jpeg_image(&local_3740,x,y,comp,req_comp);
  }
  else {
    failure_reason = "Corrupt JPEG";
    lVar5 = 0;
    pbVar10 = buffer;
    do {
      if (pbVar10 < pbVar6) {
        bVar7 = *pbVar10;
        pbVar10 = pbVar10 + 1;
      }
      else {
        bVar7 = 0;
      }
      if (bVar7 != (&check_png_header_png_sig)[lVar5]) {
        failure_reason = "Not a PNG";
        local_3740.s.img_file = (FILE *)0x0;
        local_3740.s.img_buffer = buffer;
        local_3740.s.img_buffer_end = pbVar6;
        iVar2 = bmp_test(&local_3740.s);
        if (iVar2 != 0) {
          local_3740.s.img_file = (FILE *)0x0;
          local_3740.s.img_buffer = buffer;
          local_3740.s.img_buffer_end = pbVar6;
          psVar4 = bmp_load(&local_3740.s,x,y,comp,req_comp);
          return psVar4;
        }
        local_3740.s.img_file = (FILE *)0x0;
        local_3740.s.img_buffer = buffer;
        local_3740.s.img_buffer_end = pbVar6;
        uVar3 = get32(&local_3740.s);
        if (uVar3 == 0x38425053) {
          local_3740.s.img_file = (FILE *)0x0;
          local_3740.s.img_buffer = buffer;
          local_3740.s.img_buffer_end = pbVar6;
          psVar4 = psd_load(&local_3740.s,x,y,comp,req_comp);
          return psVar4;
        }
        local_3740.s.img_file = (FILE *)0x0;
        local_3740.s.img_buffer = buffer;
        local_3740.s.img_buffer_end = pbVar6;
        iVar2 = dds_test(&local_3740.s);
        if (iVar2 != 0) {
          local_3740.s.img_file = (FILE *)0x0;
          local_3740.s.img_buffer = buffer;
          local_3740.s.img_buffer_end = pbVar6;
          psVar4 = dds_load(&local_3740.s,x,y,comp,req_comp);
          return psVar4;
        }
        cVar8 = '#';
        lVar5 = 1;
        pbVar10 = buffer;
        while( true ) {
          uVar9 = 0;
          if (pbVar10 < pbVar6) {
            uVar9 = (uint)*pbVar10;
            pbVar10 = pbVar10 + 1;
          }
          if (uVar9 != (int)cVar8) break;
          cVar8 = "#?RADIANCE\n"[lVar5];
          lVar5 = lVar5 + 1;
          if (lVar5 == 0xc) {
            local_3740.s.img_file = (FILE *)0x0;
            local_3740.s.img_buffer = buffer;
            local_3740.s.img_buffer_end = pbVar6;
            data = hdr_load(&local_3740.s,x,y,comp,req_comp);
            if (req_comp == 0) {
              req_comp = *comp;
            }
            psVar4 = hdr_to_ldr(data,*x,*y,req_comp);
            return psVar4;
          }
        }
        if (0 < max_loaders) {
          ppsVar11 = loaders;
          lVar5 = 0;
          do {
            iVar2 = (*(*ppsVar11)->test_memory)(buffer,len);
            if (iVar2 != 0) {
              psVar4 = (*(*ppsVar11)->load_from_memory)(buffer,len,x,y,comp,req_comp);
              return psVar4;
            }
            lVar5 = lVar5 + 1;
            ppsVar11 = ppsVar11 + 1;
          } while (lVar5 < max_loaders);
        }
        local_3740.s.img_file = (FILE *)0x0;
        local_3740.s.img_buffer = buffer;
        local_3740.s.img_buffer_end = pbVar6;
        iVar2 = tga_test(&local_3740.s);
        if (iVar2 != 0) {
          local_3740.s.img_file = (FILE *)0x0;
          local_3740.s.img_buffer = buffer;
          local_3740.s.img_buffer_end = pbVar6;
          psVar4 = tga_load(&local_3740.s,x,y,comp,req_comp);
          return psVar4;
        }
        failure_reason = "Image not of any known type, or corrupt";
        return (stbi_uc *)0x0;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != 8);
    local_3740.s.img_file = (FILE *)0x0;
    local_3740.s.img_buffer = buffer;
    local_3740.s.img_buffer_end = pbVar6;
    psVar4 = do_png((png *)&local_3740,x,y,comp,req_comp);
  }
  return psVar4;
}

Assistant:

unsigned char *stbi_load_from_memory(stbi_uc const *buffer, int len, int *x, int *y, int *comp, int req_comp)
{
   int i;
   if (stbi_jpeg_test_memory(buffer,len))
      return stbi_jpeg_load_from_memory(buffer,len,x,y,comp,req_comp);
   if (stbi_png_test_memory(buffer,len))
      return stbi_png_load_from_memory(buffer,len,x,y,comp,req_comp);
   if (stbi_bmp_test_memory(buffer,len))
      return stbi_bmp_load_from_memory(buffer,len,x,y,comp,req_comp);
   if (stbi_psd_test_memory(buffer,len))
      return stbi_psd_load_from_memory(buffer,len,x,y,comp,req_comp);
   #ifndef STBI_NO_DDS
   if (stbi_dds_test_memory(buffer,len))
      return stbi_dds_load_from_memory(buffer,len,x,y,comp,req_comp);
   #endif
   #ifndef STBI_NO_HDR
   if (stbi_hdr_test_memory(buffer, len)) {
      float *hdr = stbi_hdr_load_from_memory(buffer, len,x,y,comp,req_comp);
      return hdr_to_ldr(hdr, *x, *y, req_comp ? req_comp : *comp);
   }
   #endif
   for (i=0; i < max_loaders; ++i)
      if (loaders[i]->test_memory(buffer,len))
         return loaders[i]->load_from_memory(buffer,len,x,y,comp,req_comp);
   // test tga last because it's a crappy test!
   if (stbi_tga_test_memory(buffer,len))
      return stbi_tga_load_from_memory(buffer,len,x,y,comp,req_comp);
   return epuc("unknown image type", "Image not of any known type, or corrupt");
}